

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

void __thiscall
QDockAreaLayout::getGrid
          (QDockAreaLayout *this,QList<QLayoutStruct> *_ver_struct_list,
          QList<QLayoutStruct> *_hor_struct_list)

{
  QDockAreaLayoutInfo *this_00;
  QDockAreaLayoutInfo *this_01;
  QDockAreaLayoutInfo *this_02;
  QDockAreaLayoutInfo *this_03;
  int iVar1;
  int iVar2;
  QSize QVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint extraout_var;
  uint extraout_var_00;
  int extraout_var_01;
  QSize QVar11;
  QSize QVar12;
  QSize QVar13;
  QSize QVar14;
  QSize QVar15;
  QSize QVar16;
  QSize QVar17;
  QSize QVar18;
  QSize QVar19;
  QSize QVar20;
  pointer pQVar21;
  pointer pQVar22;
  uint uVar23;
  Representation RVar24;
  Representation RVar25;
  Representation RVar26;
  Representation RVar27;
  Representation RVar28;
  QList<QLayoutStruct> *hor_struct_list;
  Representation RVar29;
  long lVar30;
  ulong uVar31;
  byte bVar32;
  Representation RVar33;
  Representation RVar34;
  Representation RVar35;
  uint uVar36;
  ulong uVar37;
  QSize QVar38;
  bool bVar39;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  uint local_c8;
  
  iVar10 = 0;
  if (this->centralWidgetItem == (QLayoutItem *)0x0) {
    bVar32 = false;
  }
  else {
    iVar8 = (*this->centralWidgetItem->_vptr_QLayoutItem[8])();
    bVar32 = (byte)iVar8 ^ 1;
  }
  iVar8 = 0;
  local_c8 = 0;
  uVar4 = 0;
  uVar9 = 0;
  uVar23 = 0;
  if ((bool)bVar32 != false) {
    uVar9 = ((this->centralWidgetRect).x2.m_i - (this->centralWidgetRect).x1.m_i) + 1;
    uVar23 = ((this->centralWidgetRect).y2.m_i - (this->centralWidgetRect).y1.m_i) + 1;
    if ((int)(uVar9 | uVar23) < 0) {
      uVar9 = (*this->centralWidgetItem->_vptr_QLayoutItem[2])();
      uVar23 = extraout_var;
    }
    local_c8 = (*this->centralWidgetItem->_vptr_QLayoutItem[3])();
    iVar10 = (*this->centralWidgetItem->_vptr_QLayoutItem[4])();
    uVar4 = extraout_var_00;
    iVar8 = extraout_var_01;
  }
  local_100 = (this->rect).x1.m_i;
  local_108 = (this->rect).y1.m_i;
  local_fc = (this->rect).x2.m_i;
  local_104 = (this->rect).y2.m_i;
  this_00 = this->docks;
  uVar37 = 0;
  lVar30 = 0;
  do {
    if ((ulong)this->docks[0].item_list.d.size <= uVar37) goto LAB_003fe578;
    bVar5 = QDockAreaLayoutItem::skip
                      ((QDockAreaLayoutItem *)
                       ((long)&(this->docks[0].item_list.d.ptr)->widgetItem + lVar30));
    lVar30 = lVar30 + 0x28;
    uVar37 = uVar37 + 1;
  } while (bVar5);
  if (lVar30 != 0) {
    local_100 = (((this->rect).x1.m_i + this->docks[0].rect.x2.m_i) - this->docks[0].rect.x1.m_i) +
                this->sep + 1;
  }
LAB_003fe578:
  this_01 = this->docks + 2;
  uVar37 = 0;
  lVar30 = 0;
  do {
    if ((ulong)this->docks[2].item_list.d.size <= uVar37) goto LAB_003fe5d8;
    bVar5 = QDockAreaLayoutItem::skip
                      ((QDockAreaLayoutItem *)
                       ((long)&(this->docks[2].item_list.d.ptr)->widgetItem + lVar30));
    lVar30 = lVar30 + 0x28;
    uVar37 = uVar37 + 1;
  } while (bVar5);
  if (lVar30 != 0) {
    local_108 = (((this->rect).y1.m_i + this->docks[2].rect.y2.m_i) - this->docks[2].rect.y1.m_i) +
                this->sep + 1;
  }
LAB_003fe5d8:
  this_02 = this->docks + 1;
  uVar37 = 0;
  lVar30 = 0;
  do {
    if ((ulong)this->docks[1].item_list.d.size <= uVar37) goto LAB_003fe631;
    bVar5 = QDockAreaLayoutItem::skip
                      ((QDockAreaLayoutItem *)
                       ((long)&(this->docks[1].item_list.d.ptr)->widgetItem + lVar30));
    lVar30 = lVar30 + 0x28;
    uVar37 = uVar37 + 1;
  } while (bVar5);
  if (lVar30 != 0) {
    local_fc = (~this->docks[1].rect.x2.m_i + (this->rect).x2.m_i + this->docks[1].rect.x1.m_i) -
               this->sep;
  }
LAB_003fe631:
  this_03 = this->docks + 3;
  uVar37 = 0;
  lVar30 = 0;
  do {
    if ((ulong)this->docks[3].item_list.d.size <= uVar37) goto LAB_003fe68a;
    bVar5 = QDockAreaLayoutItem::skip
                      ((QDockAreaLayoutItem *)
                       ((long)&(this->docks[3].item_list.d.ptr)->widgetItem + lVar30));
    lVar30 = lVar30 + 0x28;
    uVar37 = uVar37 + 1;
  } while (bVar5);
  if (lVar30 != 0) {
    local_104 = (~this->docks[3].rect.y2.m_i + (this->rect).y2.m_i + this->docks[3].rect.y1.m_i) -
                this->sep;
  }
LAB_003fe68a:
  QVar11 = QDockAreaLayoutInfo::size(this_00);
  if (((ulong)QVar11 >> 0x20 == 0 && QVar11.wd.m_i.m_i == 0) || (this->fallbackToSizeHints == true))
  {
    QVar11 = QDockAreaLayoutInfo::sizeHint(this_00);
  }
  QVar12 = QDockAreaLayoutInfo::minimumSize(this_00);
  RVar28 = QVar12.ht.m_i;
  QVar13 = QDockAreaLayoutInfo::maximumSize(this_00);
  QVar3 = QVar11;
  if (QVar13.wd.m_i.m_i <= QVar11.wd.m_i.m_i) {
    QVar3 = QVar13;
  }
  RVar24.m_i = QVar13.ht.m_i.m_i;
  if (QVar11.ht.m_i.m_i < QVar13.ht.m_i.m_i) {
    RVar24.m_i = QVar11.ht.m_i.m_i;
  }
  if (QVar3.wd.m_i.m_i <= QVar12.wd.m_i.m_i) {
    QVar3 = QVar12;
  }
  if (RVar24.m_i <= RVar28.m_i) {
    RVar24.m_i = RVar28.m_i;
  }
  QVar11 = QDockAreaLayoutInfo::size(this_02);
  if (((ulong)QVar11 >> 0x20 == 0 && QVar11.wd.m_i.m_i == 0) ||
     (QVar38 = QVar11, this->fallbackToSizeHints == true)) {
    QVar11 = QDockAreaLayoutInfo::sizeHint(this_02);
    QVar38 = (QSize)((ulong)QVar11 & 0xffffffff);
  }
  QVar14 = QDockAreaLayoutInfo::minimumSize(this_02);
  RVar34 = QVar14.ht.m_i;
  QVar15 = QDockAreaLayoutInfo::maximumSize(this_02);
  if (QVar15.wd.m_i.m_i <= QVar38.wd.m_i.m_i) {
    QVar38 = QVar15;
  }
  RVar25.m_i = QVar15.ht.m_i.m_i;
  if (QVar11.ht.m_i.m_i < QVar15.ht.m_i.m_i) {
    RVar25.m_i = QVar11.ht.m_i.m_i;
  }
  if (QVar38.wd.m_i.m_i <= QVar14.wd.m_i.m_i) {
    QVar38 = QVar14;
  }
  if (RVar25.m_i <= RVar34.m_i) {
    RVar25.m_i = RVar34.m_i;
  }
  QVar11 = QDockAreaLayoutInfo::size(this_01);
  if (((ulong)QVar11 >> 0x20 == 0 && QVar11.wd.m_i.m_i == 0) ||
     (QVar16 = QVar11, this->fallbackToSizeHints == true)) {
    QVar16 = QDockAreaLayoutInfo::sizeHint(this_01);
    QVar11 = (QSize)((ulong)QVar16 & 0xffffffff);
  }
  QVar17 = QDockAreaLayoutInfo::minimumSize(this_01);
  RVar33 = QVar17.ht.m_i;
  QVar18 = QDockAreaLayoutInfo::maximumSize(this_01);
  if (QVar18.wd.m_i.m_i <= QVar11.wd.m_i.m_i) {
    QVar11 = QVar18;
  }
  RVar26 = QVar18.ht.m_i;
  RVar29.m_i = QVar16.ht.m_i.m_i;
  if (RVar26.m_i <= QVar16.ht.m_i.m_i) {
    RVar29.m_i = RVar26.m_i;
  }
  if (QVar11.wd.m_i.m_i <= QVar17.wd.m_i.m_i) {
    QVar11 = QVar17;
  }
  if (RVar29.m_i <= RVar33.m_i) {
    RVar29.m_i = RVar33.m_i;
  }
  QVar16 = QDockAreaLayoutInfo::size(this_03);
  if (((ulong)QVar16 >> 0x20 == 0 && QVar16.wd.m_i.m_i == 0) ||
     (QVar18 = QVar16, this->fallbackToSizeHints == true)) {
    QVar16 = QDockAreaLayoutInfo::sizeHint(this_03);
    QVar18 = (QSize)((ulong)QVar16 & 0xffffffff);
  }
  QVar19 = QDockAreaLayoutInfo::minimumSize(this_03);
  RVar35 = QVar19.ht.m_i;
  QVar20 = QDockAreaLayoutInfo::maximumSize(this_03);
  if (QVar20.wd.m_i.m_i <= QVar18.wd.m_i.m_i) {
    QVar18 = QVar20;
  }
  if (QVar20.ht.m_i.m_i <= QVar16.ht.m_i.m_i) {
    QVar16 = QVar20;
  }
  if (QVar18.wd.m_i.m_i <= QVar19.wd.m_i.m_i) {
    QVar18 = QVar19;
  }
  RVar27.m_i = QVar16.ht.m_i.m_i;
  if (QVar16.ht.m_i.m_i <= RVar35.m_i) {
    RVar27.m_i = RVar35.m_i;
  }
  if (_ver_struct_list != (QList<QLayoutStruct> *)0x0) {
    QList<QLayoutStruct>::resize(_ver_struct_list,3);
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21->stretch = 0;
    pQVar21->sizeHint = 0;
    pQVar21->maximumSize = 0x7ffff;
    pQVar21->minimumSize = 0;
    pQVar21->expansive = false;
    pQVar21->empty = true;
    uVar37 = 0;
    pQVar21->spacing = 0;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21->stretch = 0;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21->sizeHint = RVar29.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21->minimumSize = RVar33.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21->maximumSize = RVar26.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21->expansive = false;
    lVar30 = 0;
    do {
      if ((ulong)this->docks[2].item_list.d.size <= uVar37) {
        bVar5 = true;
        goto LAB_003fe9c2;
      }
      bVar5 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         ((long)&(this->docks[2].item_list.d.ptr)->widgetItem + lVar30));
      lVar30 = lVar30 + 0x28;
      uVar37 = uVar37 + 1;
    } while (bVar5);
    bVar5 = lVar30 == 0;
LAB_003fe9c2:
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21->empty = bVar5;
    iVar1 = this->docks[2].rect.y1.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21->pos = iVar1;
    iVar1 = this->docks[2].rect.y2.m_i;
    iVar2 = this->docks[2].rect.y1.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21->size = (iVar1 - iVar2) + 1;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[1].stretch = 0;
    pQVar21[1].sizeHint = 0;
    pQVar21[1].maximumSize = 0x7ffff;
    pQVar21[1].minimumSize = 0;
    pQVar21[1].expansive = false;
    pQVar21[1].empty = true;
    pQVar21[1].spacing = 0;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[1].stretch = uVar23;
    if (this->corners[0] == TopDockWidgetArea) {
LAB_003fea34:
      bVar5 = false;
    }
    else {
      uVar37 = 0;
      lVar30 = 0;
      do {
        if ((ulong)this->docks[2].item_list.d.size <= uVar37) goto LAB_003fea34;
        bVar5 = QDockAreaLayoutItem::skip
                          ((QDockAreaLayoutItem *)
                           ((long)&(this->docks[2].item_list.d.ptr)->widgetItem + lVar30));
        lVar30 = lVar30 + 0x28;
        uVar37 = uVar37 + 1;
      } while (bVar5);
      bVar5 = lVar30 != 0;
    }
    if (this->corners[2] == BottomDockWidgetArea) {
LAB_003fea78:
      bVar39 = false;
    }
    else {
      uVar37 = 0;
      lVar30 = 0;
      do {
        if ((ulong)this->docks[3].item_list.d.size <= uVar37) goto LAB_003fea78;
        bVar39 = QDockAreaLayoutItem::skip
                           ((QDockAreaLayoutItem *)
                            ((long)&(this->docks[3].item_list.d.ptr)->widgetItem + lVar30));
        lVar30 = lVar30 + 0x28;
        uVar37 = uVar37 + 1;
      } while (bVar39);
      bVar39 = lVar30 != 0;
    }
    if (this->corners[1] == TopDockWidgetArea) {
LAB_003feab4:
      bVar7 = false;
    }
    else {
      uVar37 = 0;
      lVar30 = 0;
      do {
        if ((ulong)this->docks[2].item_list.d.size <= uVar37) goto LAB_003feab4;
        bVar7 = QDockAreaLayoutItem::skip
                          ((QDockAreaLayoutItem *)
                           ((long)&(this->docks[2].item_list.d.ptr)->widgetItem + lVar30));
        lVar30 = lVar30 + 0x28;
        uVar37 = uVar37 + 1;
      } while (bVar7);
      bVar7 = lVar30 != 0;
    }
    uVar37 = 0;
    uVar36 = 0;
    bVar6 = false;
    if (this->corners[3] != BottomDockWidgetArea) {
      uVar31 = 0;
      lVar30 = 0;
      do {
        if ((ulong)this->docks[3].item_list.d.size <= uVar31) {
          bVar6 = false;
          goto LAB_003feb37;
        }
        bVar6 = QDockAreaLayoutItem::skip
                          ((QDockAreaLayoutItem *)
                           ((long)&(this->docks[3].item_list.d.ptr)->widgetItem + lVar30));
        lVar30 = lVar30 + 0x28;
        uVar31 = uVar31 + 1;
      } while (bVar6);
      bVar6 = lVar30 != 0;
    }
LAB_003feb37:
    if (bVar7 || bVar6) {
      RVar34.m_i = uVar36;
      RVar25.m_i = uVar36;
    }
    if (RVar25.m_i < (int)uVar23) {
      RVar25.m_i = uVar23;
    }
    if (bVar5 || bVar39) {
      RVar28.m_i = uVar36;
      RVar24.m_i = uVar36;
    }
    if (RVar24.m_i < RVar25.m_i) {
      RVar24.m_i = RVar25.m_i;
    }
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    if (RVar34.m_i < (int)uVar4) {
      RVar34.m_i = uVar4;
    }
    pQVar21[1].sizeHint = RVar24.m_i;
    if (RVar34.m_i <= RVar28.m_i) {
      RVar34.m_i = RVar28.m_i;
    }
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[1].minimumSize = RVar34.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[1].maximumSize = iVar8;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[1].expansive = (bool)bVar32;
    lVar30 = 0;
    do {
      if ((ulong)this->docks[0].item_list.d.size <= uVar37) {
        bVar5 = false;
        goto LAB_003febfb;
      }
      bVar5 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         ((long)&(this->docks[0].item_list.d.ptr)->widgetItem + lVar30));
      lVar30 = lVar30 + 0x28;
      uVar37 = uVar37 + 1;
    } while (bVar5);
    bVar5 = lVar30 != 0;
LAB_003febfb:
    uVar37 = 0;
    bVar39 = false;
    if (!bVar5 && (bool)bVar32 == false) {
      uVar31 = 0;
      lVar30 = 0;
      do {
        if ((ulong)this->docks[1].item_list.d.size <= uVar31) {
          bVar39 = true;
          goto LAB_003fec42;
        }
        bVar5 = QDockAreaLayoutItem::skip
                          ((QDockAreaLayoutItem *)
                           ((long)&(this->docks[1].item_list.d.ptr)->widgetItem + lVar30));
        lVar30 = lVar30 + 0x28;
        uVar31 = uVar31 + 1;
      } while (bVar5);
      bVar39 = lVar30 == 0;
    }
LAB_003fec42:
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[1].empty = bVar39;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[1].pos = local_108;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[1].size = (local_104 - local_108) + 1;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[2].stretch = 0;
    pQVar21[2].sizeHint = 0;
    pQVar21[2].maximumSize = 0x7ffff;
    pQVar21[2].minimumSize = 0;
    pQVar21[2].expansive = false;
    pQVar21[2].empty = true;
    pQVar21[2].spacing = 0;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[2].stretch = 0;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[2].sizeHint = RVar27.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[2].minimumSize = RVar35.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[2].maximumSize = QVar20.ht.m_i.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[2].expansive = false;
    lVar30 = 0;
    do {
      if ((ulong)this->docks[3].item_list.d.size <= uVar37) {
        bVar5 = true;
        goto LAB_003fed0e;
      }
      bVar5 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         ((long)&(this->docks[3].item_list.d.ptr)->widgetItem + lVar30));
      lVar30 = lVar30 + 0x28;
      uVar37 = uVar37 + 1;
    } while (bVar5);
    bVar5 = lVar30 == 0;
LAB_003fed0e:
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[2].empty = bVar5;
    iVar8 = this->docks[3].rect.y1.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[2].pos = iVar8;
    iVar8 = this->docks[3].rect.y2.m_i;
    iVar1 = this->docks[3].rect.y1.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[2].size = (iVar8 - iVar1) + 1;
    lVar30 = 0;
    do {
      pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
      pQVar22 = QList<QLayoutStruct>::data(_ver_struct_list);
      iVar8 = *(int *)((long)&pQVar21->sizeHint + lVar30);
      iVar1 = *(int *)((long)&pQVar22->minimumSize + lVar30);
      if (iVar1 < iVar8) {
        iVar1 = iVar8;
      }
      pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
      *(int *)((long)&pQVar21->sizeHint + lVar30) = iVar1;
      lVar30 = lVar30 + 0x20;
    } while (lVar30 != 0x60);
    if ((((bool)bVar32 != false) &&
        (pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list), pQVar21->empty == true)) &&
       (pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list), pQVar21[2].empty == true)) {
      pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
      pQVar21[1].maximumSize = 0xffffff;
    }
  }
  if (_hor_struct_list != (QList<QLayoutStruct> *)0x0) {
    QList<QLayoutStruct>::resize(_hor_struct_list,3);
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21->stretch = 0;
    pQVar21->sizeHint = 0;
    pQVar21->maximumSize = 0x7ffff;
    pQVar21->minimumSize = 0;
    pQVar21->expansive = false;
    pQVar21->empty = true;
    uVar37 = 0;
    pQVar21->spacing = 0;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21->stretch = 0;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21->sizeHint = QVar3.wd.m_i.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21->minimumSize = QVar12.wd.m_i.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21->maximumSize = QVar13.wd.m_i.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21->expansive = false;
    lVar30 = 0;
    do {
      if ((ulong)this->docks[0].item_list.d.size <= uVar37) {
        bVar5 = true;
        goto LAB_003fee76;
      }
      bVar5 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         ((long)&(this->docks[0].item_list.d.ptr)->widgetItem + lVar30));
      lVar30 = lVar30 + 0x28;
      uVar37 = uVar37 + 1;
    } while (bVar5);
    bVar5 = lVar30 == 0;
LAB_003fee76:
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21->empty = bVar5;
    iVar8 = this->docks[0].rect.x1.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21->pos = iVar8;
    iVar8 = this->docks[0].rect.x2.m_i;
    iVar1 = this->docks[0].rect.x1.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21->size = (iVar8 - iVar1) + 1;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[1].stretch = 0;
    pQVar21[1].sizeHint = 0;
    pQVar21[1].maximumSize = 0x7ffff;
    pQVar21[1].minimumSize = 0;
    pQVar21[1].expansive = false;
    pQVar21[1].empty = true;
    pQVar21[1].spacing = 0;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[1].stretch = uVar9;
    if (this->corners[0] == LeftDockWidgetArea) {
LAB_003feedc:
      bVar5 = false;
    }
    else {
      uVar37 = 0;
      lVar30 = 0;
      do {
        if ((ulong)this->docks[0].item_list.d.size <= uVar37) goto LAB_003feedc;
        bVar5 = QDockAreaLayoutItem::skip
                          ((QDockAreaLayoutItem *)
                           ((long)&(this->docks[0].item_list.d.ptr)->widgetItem + lVar30));
        lVar30 = lVar30 + 0x28;
        uVar37 = uVar37 + 1;
      } while (bVar5);
      bVar5 = lVar30 != 0;
    }
    if (this->corners[1] == RightDockWidgetArea) {
LAB_003fef20:
      bVar39 = false;
    }
    else {
      uVar37 = 0;
      lVar30 = 0;
      do {
        if ((ulong)this->docks[1].item_list.d.size <= uVar37) goto LAB_003fef20;
        bVar39 = QDockAreaLayoutItem::skip
                           ((QDockAreaLayoutItem *)
                            ((long)&(this->docks[1].item_list.d.ptr)->widgetItem + lVar30));
        lVar30 = lVar30 + 0x28;
        uVar37 = uVar37 + 1;
      } while (bVar39);
      bVar39 = lVar30 != 0;
    }
    if (this->corners[2] == LeftDockWidgetArea) {
LAB_003fef5b:
      bVar7 = false;
    }
    else {
      uVar37 = 0;
      lVar30 = 0;
      do {
        if ((ulong)this->docks[0].item_list.d.size <= uVar37) goto LAB_003fef5b;
        bVar7 = QDockAreaLayoutItem::skip
                          ((QDockAreaLayoutItem *)
                           ((long)&(this->docks[0].item_list.d.ptr)->widgetItem + lVar30));
        lVar30 = lVar30 + 0x28;
        uVar37 = uVar37 + 1;
      } while (bVar7);
      bVar7 = lVar30 != 0;
    }
    uVar37 = 0;
    uVar23 = 0;
    bVar6 = false;
    if (this->corners[3] != RightDockWidgetArea) {
      uVar31 = 0;
      lVar30 = 0;
      do {
        if ((ulong)this->docks[1].item_list.d.size <= uVar31) {
          bVar6 = false;
          goto LAB_003fefd9;
        }
        bVar6 = QDockAreaLayoutItem::skip
                          ((QDockAreaLayoutItem *)
                           ((long)&(this->docks[1].item_list.d.ptr)->widgetItem + lVar30));
        lVar30 = lVar30 + 0x28;
        uVar31 = uVar31 + 1;
      } while (bVar6);
      bVar6 = lVar30 != 0;
    }
LAB_003fefd9:
    RVar28.m_i = QVar19.wd.m_i.m_i;
    RVar24.m_i = QVar18.wd.m_i.m_i;
    if (bVar7 || bVar6) {
      RVar28.m_i = uVar23;
      RVar24.m_i = uVar23;
    }
    if (RVar24.m_i < (int)uVar9) {
      RVar24.m_i = uVar9;
    }
    RVar25.m_i = QVar17.wd.m_i.m_i;
    RVar34.m_i = QVar11.wd.m_i.m_i;
    if (bVar5 || bVar39) {
      RVar25.m_i = uVar23;
      RVar34.m_i = uVar23;
    }
    if (RVar34.m_i < RVar24.m_i) {
      RVar34.m_i = RVar24.m_i;
    }
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    if (RVar28.m_i < (int)local_c8) {
      RVar28.m_i = local_c8;
    }
    pQVar21[1].sizeHint = RVar34.m_i;
    if (RVar28.m_i <= RVar25.m_i) {
      RVar28.m_i = RVar25.m_i;
    }
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[1].minimumSize = RVar28.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[1].maximumSize = iVar10;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[1].expansive = (bool)bVar32;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[1].empty = (bool)(bVar32 ^ 1);
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[1].pos = local_100;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[1].size = (local_fc - local_100) + 1;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[2].stretch = 0;
    pQVar21[2].sizeHint = 0;
    pQVar21[2].maximumSize = 0x7ffff;
    pQVar21[2].minimumSize = 0;
    pQVar21[2].expansive = false;
    pQVar21[2].empty = true;
    pQVar21[2].spacing = 0;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[2].stretch = 0;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[2].sizeHint = QVar38.wd.m_i.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[2].minimumSize = QVar14.wd.m_i.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[2].maximumSize = QVar15.wd.m_i.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[2].expansive = false;
    lVar30 = 0;
    do {
      if ((ulong)this->docks[1].item_list.d.size <= uVar37) {
        bVar5 = true;
        goto LAB_003ff141;
      }
      bVar5 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         ((long)&(this->docks[1].item_list.d.ptr)->widgetItem + lVar30));
      lVar30 = lVar30 + 0x28;
      uVar37 = uVar37 + 1;
    } while (bVar5);
    bVar5 = lVar30 == 0;
LAB_003ff141:
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[2].empty = bVar5;
    iVar10 = this->docks[1].rect.x1.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[2].pos = iVar10;
    iVar10 = this->docks[1].rect.x2.m_i;
    iVar8 = this->docks[1].rect.x1.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[2].size = (iVar10 - iVar8) + 1;
    lVar30 = 0;
    do {
      pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
      pQVar22 = QList<QLayoutStruct>::data(_hor_struct_list);
      iVar10 = *(int *)((long)&pQVar21->sizeHint + lVar30);
      iVar8 = *(int *)((long)&pQVar22->minimumSize + lVar30);
      if (iVar8 < iVar10) {
        iVar8 = iVar10;
      }
      pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
      *(int *)((long)&pQVar21->sizeHint + lVar30) = iVar8;
      lVar30 = lVar30 + 0x20;
    } while (lVar30 != 0x60);
    if ((((bool)bVar32 != false) &&
        (pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list), pQVar21->empty == true)) &&
       (pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list), pQVar21[2].empty == true)) {
      pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
      pQVar21[1].maximumSize = 0xffffff;
    }
  }
  return;
}

Assistant:

void QDockAreaLayout::getGrid(QList<QLayoutStruct> *_ver_struct_list,
                              QList<QLayoutStruct> *_hor_struct_list)
{
    QSize center_hint(0, 0);
    QSize center_min(0, 0);
    QSize center_max(0, 0);
    const bool have_central = centralWidgetItem != nullptr && !centralWidgetItem->isEmpty();
    if (have_central) {
        center_hint = centralWidgetRect.size();
        if (!center_hint.isValid())
            center_hint = centralWidgetItem->sizeHint();
        center_min = centralWidgetItem->minimumSize();
        center_max = centralWidgetItem->maximumSize();
    }

    QRect center_rect = rect;
    if (!docks[QInternal::LeftDock].isEmpty())
        center_rect.setLeft(rect.left() + docks[QInternal::LeftDock].rect.width() + sep);
    if (!docks[QInternal::TopDock].isEmpty())
        center_rect.setTop(rect.top() + docks[QInternal::TopDock].rect.height() + sep);
    if (!docks[QInternal::RightDock].isEmpty())
        center_rect.setRight(rect.right() - docks[QInternal::RightDock].rect.width() - sep);
    if (!docks[QInternal::BottomDock].isEmpty())
        center_rect.setBottom(rect.bottom() - docks[QInternal::BottomDock].rect.height() - sep);

    QSize left_hint = docks[QInternal::LeftDock].size();
    if (left_hint.isNull() || fallbackToSizeHints)
        left_hint = docks[QInternal::LeftDock].sizeHint();
    QSize left_min = docks[QInternal::LeftDock].minimumSize();
    QSize left_max = docks[QInternal::LeftDock].maximumSize();
    left_hint = left_hint.boundedTo(left_max).expandedTo(left_min);

    QSize right_hint = docks[QInternal::RightDock].size();
    if (right_hint.isNull() || fallbackToSizeHints)
        right_hint = docks[QInternal::RightDock].sizeHint();
    QSize right_min = docks[QInternal::RightDock].minimumSize();
    QSize right_max = docks[QInternal::RightDock].maximumSize();
    right_hint = right_hint.boundedTo(right_max).expandedTo(right_min);

    QSize top_hint = docks[QInternal::TopDock].size();
    if (top_hint.isNull() || fallbackToSizeHints)
        top_hint = docks[QInternal::TopDock].sizeHint();
    QSize top_min = docks[QInternal::TopDock].minimumSize();
    QSize top_max = docks[QInternal::TopDock].maximumSize();
    top_hint = top_hint.boundedTo(top_max).expandedTo(top_min);

    QSize bottom_hint = docks[QInternal::BottomDock].size();
    if (bottom_hint.isNull() || fallbackToSizeHints)
        bottom_hint = docks[QInternal::BottomDock].sizeHint();
    QSize bottom_min = docks[QInternal::BottomDock].minimumSize();
    QSize bottom_max = docks[QInternal::BottomDock].maximumSize();
    bottom_hint = bottom_hint.boundedTo(bottom_max).expandedTo(bottom_min);

    if (_ver_struct_list != nullptr) {
        QList<QLayoutStruct> &ver_struct_list = *_ver_struct_list;
        ver_struct_list.resize(3);

        // top --------------------------------------------------
        ver_struct_list[0].init();
        ver_struct_list[0].stretch = 0;
        ver_struct_list[0].sizeHint = top_hint.height();
        ver_struct_list[0].minimumSize = top_min.height();
        ver_struct_list[0].maximumSize = top_max.height();
        ver_struct_list[0].expansive = false;
        ver_struct_list[0].empty = docks[QInternal::TopDock].isEmpty();
        ver_struct_list[0].pos = docks[QInternal::TopDock].rect.top();
        ver_struct_list[0].size = docks[QInternal::TopDock].rect.height();

        // center --------------------------------------------------
        ver_struct_list[1].init();
        ver_struct_list[1].stretch = center_hint.height();

        bool tl_significant = corners[Qt::TopLeftCorner] == Qt::TopDockWidgetArea
                                    || docks[QInternal::TopDock].isEmpty();
        bool bl_significant = corners[Qt::BottomLeftCorner] == Qt::BottomDockWidgetArea
                                    || docks[QInternal::BottomDock].isEmpty();
        bool tr_significant = corners[Qt::TopRightCorner] == Qt::TopDockWidgetArea
                                    || docks[QInternal::TopDock].isEmpty();
        bool br_significant = corners[Qt::BottomRightCorner] == Qt::BottomDockWidgetArea
                                    || docks[QInternal::BottomDock].isEmpty();

        int left = (tl_significant && bl_significant) ? left_hint.height() : 0;
        int right = (tr_significant && br_significant) ? right_hint.height() : 0;
        ver_struct_list[1].sizeHint = qMax(left, center_hint.height(), right);

        left = (tl_significant && bl_significant) ? left_min.height() : 0;
        right = (tr_significant && br_significant) ? right_min.height() : 0;
        ver_struct_list[1].minimumSize = qMax(left, center_min.height(), right);
        ver_struct_list[1].maximumSize = center_max.height();
        ver_struct_list[1].expansive = have_central;
        ver_struct_list[1].empty = docks[QInternal::LeftDock].isEmpty()
                                        && !have_central
                                        && docks[QInternal::RightDock].isEmpty();
        ver_struct_list[1].pos = center_rect.top();
        ver_struct_list[1].size = center_rect.height();

        // bottom --------------------------------------------------
        ver_struct_list[2].init();
        ver_struct_list[2].stretch = 0;
        ver_struct_list[2].sizeHint = bottom_hint.height();
        ver_struct_list[2].minimumSize = bottom_min.height();
        ver_struct_list[2].maximumSize = bottom_max.height();
        ver_struct_list[2].expansive = false;
        ver_struct_list[2].empty = docks[QInternal::BottomDock].isEmpty();
        ver_struct_list[2].pos = docks[QInternal::BottomDock].rect.top();
        ver_struct_list[2].size = docks[QInternal::BottomDock].rect.height();

        for (int i = 0; i < 3; ++i) {
            ver_struct_list[i].sizeHint
                = qMax(ver_struct_list[i].sizeHint, ver_struct_list[i].minimumSize);
        }
        if (have_central && ver_struct_list[0].empty && ver_struct_list[2].empty)
            ver_struct_list[1].maximumSize = QWIDGETSIZE_MAX;
    }

    if (_hor_struct_list != nullptr) {
        QList<QLayoutStruct> &hor_struct_list = *_hor_struct_list;
        hor_struct_list.resize(3);

        // left --------------------------------------------------
        hor_struct_list[0].init();
        hor_struct_list[0].stretch = 0;
        hor_struct_list[0].sizeHint = left_hint.width();
        hor_struct_list[0].minimumSize = left_min.width();
        hor_struct_list[0].maximumSize = left_max.width();
        hor_struct_list[0].expansive = false;
        hor_struct_list[0].empty = docks[QInternal::LeftDock].isEmpty();
        hor_struct_list[0].pos = docks[QInternal::LeftDock].rect.left();
        hor_struct_list[0].size = docks[QInternal::LeftDock].rect.width();

        // center --------------------------------------------------
        hor_struct_list[1].init();
        hor_struct_list[1].stretch = center_hint.width();

        bool tl_significant = corners[Qt::TopLeftCorner] == Qt::LeftDockWidgetArea
                                    || docks[QInternal::LeftDock].isEmpty();
        bool tr_significant = corners[Qt::TopRightCorner] == Qt::RightDockWidgetArea
                                    || docks[QInternal::RightDock].isEmpty();
        bool bl_significant = corners[Qt::BottomLeftCorner] == Qt::LeftDockWidgetArea
                                    || docks[QInternal::LeftDock].isEmpty();
        bool br_significant = corners[Qt::BottomRightCorner] == Qt::RightDockWidgetArea
                                    || docks[QInternal::RightDock].isEmpty();

        int top = (tl_significant && tr_significant) ? top_hint.width() : 0;
        int bottom = (bl_significant && br_significant) ? bottom_hint.width() : 0;
        hor_struct_list[1].sizeHint = qMax(top, center_hint.width(), bottom);

        top = (tl_significant && tr_significant) ? top_min.width() : 0;
        bottom = (bl_significant && br_significant) ? bottom_min.width() : 0;
        hor_struct_list[1].minimumSize = qMax(top, center_min.width(), bottom);

        hor_struct_list[1].maximumSize = center_max.width();
        hor_struct_list[1].expansive = have_central;
        hor_struct_list[1].empty = !have_central;
        hor_struct_list[1].pos = center_rect.left();
        hor_struct_list[1].size = center_rect.width();

        // right --------------------------------------------------
        hor_struct_list[2].init();
        hor_struct_list[2].stretch = 0;
        hor_struct_list[2].sizeHint = right_hint.width();
        hor_struct_list[2].minimumSize = right_min.width();
        hor_struct_list[2].maximumSize = right_max.width();
        hor_struct_list[2].expansive = false;
        hor_struct_list[2].empty = docks[QInternal::RightDock].isEmpty();
        hor_struct_list[2].pos = docks[QInternal::RightDock].rect.left();
        hor_struct_list[2].size = docks[QInternal::RightDock].rect.width();

        for (int i = 0; i < 3; ++i) {
            hor_struct_list[i].sizeHint
                = qMax(hor_struct_list[i].sizeHint, hor_struct_list[i].minimumSize);
        }
        if (have_central && hor_struct_list[0].empty && hor_struct_list[2].empty)
            hor_struct_list[1].maximumSize = QWIDGETSIZE_MAX;

    }
}